

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

BigNum * powMod(BigNum *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  ostream *this;
  double __x;
  double in_XMM1_Qa;
  BigNum local_170;
  BigNum local_150;
  pair<BigNum,_BigNum> local_130;
  string local_f0 [32];
  undefined1 local_d0 [8];
  BigNum module;
  string moduleStr;
  BigNum local_80;
  BigNum local_60;
  undefined1 local_40 [8];
  BigNum c;
  BigNum *b_local;
  BigNum *a_local;
  
  c._24_8_ = b;
  BigNum::BigNum(&local_60,a);
  BigNum::BigNum(&local_80,b);
  pow(__x,in_XMM1_Qa);
  BigNum::~BigNum(&local_80);
  BigNum::~BigNum(&local_60);
  std::__cxx11::string::string((string *)&module.length);
  this = std::operator<<((ostream *)&std::cout,"Enter module, please:");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&module.length);
  std::__cxx11::string::string(local_f0,(string *)&module.length);
  BigNum::BigNum((BigNum *)local_d0,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  BigNum::BigNum(&local_150,(BigNum *)local_40);
  BigNum::BigNum(&local_170,(BigNum *)local_d0);
  pairDivMod(&local_130,&local_150,&local_170);
  BigNum::BigNum(__return_storage_ptr__,&local_130.second);
  std::pair<BigNum,_BigNum>::~pair(&local_130);
  BigNum::~BigNum(&local_170);
  BigNum::~BigNum(&local_150);
  BigNum::~BigNum((BigNum *)local_d0);
  std::__cxx11::string::~string((string *)&module.length);
  BigNum::~BigNum((BigNum *)local_40);
  return __return_storage_ptr__;
}

Assistant:

BigNum powMod(BigNum a, BigNum b){
    BigNum c = pow(a, b);
    string moduleStr;
    cout << "Enter module, please:" << endl;
    cin >> moduleStr;
    BigNum module = BigNum(moduleStr);
    return pairDivMod(c, module).second;
}